

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O2

size_t __thiscall
libtorrent::aux::utp_stream::write_some<boost::asio::const_buffer>
          (utp_stream *this,const_buffer *buffers,error_code *ec)

{
  long lVar1;
  basic_errors val;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  
  if (this->m_impl == (utp_socket_impl *)0x0) {
    val = not_connected;
  }
  else {
    bVar2 = check_fin_sent(this);
    if (bVar2) {
      val = broken_pipe;
    }
    else {
      lVar4 = 0;
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 0x10) {
        lVar1 = *(long *)((long)&buffers->size_ + lVar5);
        if (lVar1 != 0) {
          add_write_buffer(this,*(void **)((long)&buffers->data_ + lVar5),(int)lVar1);
          lVar4 = lVar4 + *(long *)((long)&buffers->size_ + lVar5);
        }
      }
      sVar3 = write_some(this,true);
      if (sVar3 != 0) {
        return sVar3;
      }
      if (lVar4 == 0) {
        return 0;
      }
      val = try_again;
    }
  }
  boost::system::error_code::operator=(ec,val);
  return 0;
}

Assistant:

std::size_t write_some(Const_Buffers const& buffers, error_code& ec)
	{
		TORRENT_ASSERT(!m_write_handler);
		if (m_impl == nullptr)
		{
			ec = boost::asio::error::not_connected;
			return 0;
		}

		if (check_fin_sent())
		{
			// we can't send more data after closing the socket
			ec = boost::asio::error::broken_pipe;
			return 0;
		}

		size_t buf_size = 0;

		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
		{
			if (i->size() == 0) continue;
			add_write_buffer(i->data(), int(i->size()));
			buf_size += i->size();
		}
		std::size_t ret = write_some(true);
		TORRENT_ASSERT(ret <= buf_size);
		if (ret == 0 && buf_size > 0)
		{
			ec = boost::asio::error::would_block;
			return 0;
		}
		return ret;
	}